

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_trace.c
# Opt level: O2

parasail_result_t *
parasail_nw_trace(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,
                 parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  parasail_result_t *ppVar6;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  byte bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  int iVar15;
  ulong size;
  ulong size_00;
  char *__format;
  long lVar16;
  int iVar17;
  byte bVar18;
  int iVar19;
  int iVar20;
  int *piVar21;
  int *local_70;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar13 = "_s2";
  }
  else if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar13 = "s2Len";
  }
  else if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar13 = "open";
  }
  else if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar13 = "gap";
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar13 = "matrix";
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
LAB_0050064c:
      ppVar6 = parasail_result_new_trace(_s1Len,s2Len,0x10,1);
      if (ppVar6 != (parasail_result_t *)0x0) {
        ppVar6->flag = ppVar6->flag | 0x1480101;
        size_00 = (ulong)(uint)s2Len;
        ptr = parasail_memalign_int(0x10,size_00);
        size = (ulong)(s2Len + 1);
        ptr_00 = parasail_memalign_int(0x10,size);
        ptr_01 = parasail_memalign_int(0x10,size);
        if (ptr_01 != (int *)0x0 && (ptr_00 != (int *)0x0 && ptr != (int *)0x0)) {
          piVar21 = ((ppVar6->field_4).rowcols)->score_row;
          if (matrix->type == 0) {
            local_70 = parasail_memalign_int(0x10,(long)_s1Len);
            uVar11 = 0;
            if (local_70 == (int *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar12 = 0;
            if (0 < _s1Len) {
              uVar12 = (ulong)(uint)_s1Len;
            }
            for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
              local_70[uVar11] = matrix->mapper[(byte)_s1[uVar11]];
            }
          }
          else {
            local_70 = (int *)0x0;
          }
          piVar2 = matrix->mapper;
          for (uVar11 = 0; size_00 != uVar11; uVar11 = uVar11 + 1) {
            ptr[uVar11] = piVar2[(byte)_s2[uVar11]];
          }
          *ptr_00 = 0;
          *ptr_01 = -0x40000000;
          iVar4 = -open;
          for (uVar11 = 1; size != uVar11; uVar11 = uVar11 + 1) {
            ptr_00[uVar11] = iVar4;
            ptr_01[uVar11] = -0x40000000;
            iVar4 = iVar4 - gap;
          }
          uVar8 = 0;
          if (0 < _s1Len) {
            uVar8 = _s1Len;
          }
          for (uVar11 = 1; uVar11 != uVar8 + 1; uVar11 = uVar11 + 1) {
            iVar4 = matrix->size;
            lVar3 = uVar11 - 1;
            if (matrix->type == 0) {
              lVar3 = (long)local_70[uVar11 - 1];
            }
            piVar2 = matrix->matrix;
            iVar17 = *ptr_00;
            iVar14 = -((int)(uVar11 - 1) * gap + open);
            *ptr_00 = iVar14;
            iVar19 = -0x40000000;
            for (lVar16 = 0; size - 1 != lVar16; lVar16 = lVar16 + 1) {
              iVar1 = ptr_00[lVar16 + 1];
              iVar5 = iVar1 - open;
              iVar9 = ptr_01[lVar16 + 1] - gap;
              iVar10 = iVar9;
              if (iVar9 < iVar5) {
                iVar10 = iVar5;
              }
              ptr_01[lVar16 + 1] = iVar10;
              iVar15 = iVar14 - open;
              iVar20 = iVar19 - gap;
              iVar19 = iVar15;
              if (iVar15 <= iVar20) {
                iVar19 = iVar20;
              }
              iVar17 = iVar17 + piVar2[iVar4 * lVar3 + (long)ptr[lVar16]];
              iVar14 = iVar19;
              if (iVar19 < iVar17) {
                iVar14 = iVar17;
              }
              if (iVar14 <= iVar10) {
                iVar14 = iVar10;
              }
              ptr_00[lVar16 + 1] = iVar14;
              bVar18 = ((iVar5 <= iVar9) << 5 | (iVar15 <= iVar20) << 3) + 0x28;
              *(byte *)((long)piVar21 + lVar16) = bVar18;
              bVar7 = 4;
              if (iVar14 != iVar17) {
                bVar7 = (iVar14 == ptr_01[lVar16 + 1]) + 1;
              }
              *(byte *)((long)piVar21 + lVar16) = bVar7 | bVar18;
              iVar17 = iVar1;
            }
            piVar21 = (int *)((long)piVar21 + size_00);
          }
          ppVar6->score = ptr_00[size_00];
          ppVar6->end_query = _s1Len - 1;
          ppVar6->end_ref = s2Len + -1;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_70);
            return ppVar6;
          }
          return ppVar6;
        }
      }
      return (parasail_result_t *)0x0;
    }
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar13 = "_s1";
    }
    else {
      if (0 < _s1Len) goto LAB_0050064c;
      __format = "%s: %s must be > 0\n";
      pcVar13 = "_s1Len";
    }
  }
  fprintf(_stderr,__format,"parasail_nw_trace",pcVar13);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict F = NULL;
    int8_t * restrict HT = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 16, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);
    HT = (int8_t* const restrict)result->trace->trace_table;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!F) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    F[0] = NEG_INF_32;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = -open -(j-1)*gap;
        F[j] = NEG_INF_32;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = -open - (i-1)*gap;
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E    - gap;
            E    = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
            HT[1LL*(i-1)*s2Len + (j-1)] = (F_opn > F_ext) ? PARASAIL_DIAG_F
                                                          : PARASAIL_DEL_F;
            HT[1LL*(i-1)*s2Len + (j-1)] |= (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                           : PARASAIL_INS_E;
            HT[1LL*(i-1)*s2Len + (j-1)] |= (WH == H_dag) ? PARASAIL_DIAG
                                        : (WH == F[j])   ? PARASAIL_DEL
                                                         : PARASAIL_INS;
        }
    }

    result->score = H[s2Len];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;

    parasail_free(F);
    parasail_free(H);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}